

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::MultisampleTextureUsageCase::init
          (MultisampleTextureUsageCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  int extraout_EAX;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *pNVar5;
  RenderTarget *pRVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  Enum<int,_2UL> EVar9;
  GLenum local_7ec;
  GLenum local_7e8;
  GLenum local_7e4;
  MessageBuilder local_7d8;
  int local_654;
  MessageBuilder local_650;
  char *local_4d0;
  char *local_4c8;
  MessageBuilder local_4c0;
  undefined1 local_33a;
  allocator<char> local_339;
  string local_338;
  int local_318;
  undefined1 local_312;
  allocator<char> local_311;
  GLint maxTextureLayers;
  int local_2ec;
  GetNameFunc p_Stack_2e8;
  GLint maxTextureSize;
  int local_2e0;
  Enum<int,_2UL> local_2d8;
  MessageBuilder local_2c8;
  undefined1 local_142;
  allocator<char> local_141;
  string local_140;
  int local_11c;
  undefined1 local_115;
  GLint maxSamples;
  string local_110;
  int local_ec;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_65;
  allocator<char> local_51;
  string local_50;
  deUint32 local_30;
  ContextType local_2c;
  undefined1 local_25;
  undefined4 local_24;
  undefined4 uStack_20;
  bool supportsES32;
  GLenum fboAttachment;
  GLenum textureTarget;
  GLenum internalFormat;
  Functions *gl;
  MultisampleTextureUsageCase *this_local;
  
  gl = (Functions *)this;
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  _textureTarget = CONCAT44(extraout_var,iVar2);
  if ((this->m_isColorFormat & 1U) == 0) {
    if ((this->m_isSignedFormat & 1U) == 0) {
      if ((this->m_isUnsignedFormat & 1U) == 0) {
        local_7ec = 0;
        if ((this->m_isDepthFormat & 1U) != 0) {
          local_7ec = 0x8cac;
        }
      }
      else {
        local_7ec = 0x8232;
      }
      local_7e8 = local_7ec;
    }
    else {
      local_7e8 = 0x8231;
    }
    local_7e4 = local_7e8;
  }
  else {
    local_7e4 = 0x8229;
  }
  fboAttachment = local_7e4;
  uStack_20 = 0x9100;
  if ((this->m_isArrayType & 1U) != 0) {
    uStack_20 = 0x9102;
  }
  local_24 = 0x8ce0;
  if ((this->m_isDepthFormat & 1U) != 0) {
    local_24 = 0x8d00;
  }
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_2c.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  local_30 = (deUint32)glu::ApiType::es(3,2);
  local_25 = glu::contextSupports(local_2c,(ApiType)local_30);
  if (((this->m_isArrayType & 1U) != 0) && (!(bool)local_25)) {
    this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (this_00,"GL_OES_texture_storage_multisample_2d_array");
    if (!bVar1) {
      local_65 = 1;
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "Test requires OES_texture_storage_multisample_2d_array extension",&local_51);
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_50);
      local_65 = 0;
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  pRVar6 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getWidth(pRVar6);
  if (0xff < iVar2) {
    pRVar6 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = tcu::RenderTarget::getHeight(pRVar6);
    if (0xff < iVar2) {
      local_11c = 0;
      (**(code **)(_textureTarget + 0x880))(uStack_20,fboAttachment,0x80a9,1,&local_11c);
      if (local_11c < this->m_numSamples) {
        local_142 = 1;
        pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"Requested sample count is greater than supported",
                   &local_141);
        tcu::NotSupportedError::NotSupportedError(pNVar5,&local_140);
        local_142 = 0;
        __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_2c8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<(&local_2c8,(char (*) [22])"Max sample count for ");
      EVar9 = glu::getTextureFormatStr(fboAttachment);
      p_Stack_2e8 = EVar9.m_getName;
      local_2e0 = EVar9.m_value;
      local_2d8.m_getName = p_Stack_2e8;
      local_2d8.m_value = local_2e0;
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_2d8);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a18ff4);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_11c);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_2c8);
      local_2ec = 0;
      (**(code **)(_textureTarget + 0x868))(0xd33,&local_2ec);
      if (0xff < local_2ec) {
        if ((this->m_isArrayType & 1U) != 0) {
          local_318 = 0;
          (**(code **)(_textureTarget + 0x868))(0x88ff,&local_318);
          if (local_318 < 8) {
            local_33a = 1;
            pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_338,"Larger GL_MAX_ARRAY_TEXTURE_LAYERS is required",
                       &local_339);
            tcu::NotSupportedError::NotSupportedError(pNVar5,&local_338);
            local_33a = 0;
            __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                        tcu::NotSupportedError::~NotSupportedError);
          }
        }
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_4c0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<(&local_4c0,(char (*) [22])"Creating multisample ");
        local_4c8 = "";
        if ((this->m_isDepthFormat & 1U) != 0) {
          local_4c8 = "depth";
        }
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4c8);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])0x2ab8a52);
        local_4d0 = "";
        if ((this->m_isArrayType & 1U) != 0) {
          local_4d0 = " array";
        }
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4d0);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4c0);
        (**(code **)(_textureTarget + 0x6f8))(1,&this->m_textureID);
        (**(code **)(_textureTarget + 0xb8))(uStack_20,this->m_textureID);
        dVar3 = (**(code **)(_textureTarget + 0x800))();
        glu::checkError(dVar3,"bind texture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                        ,0x492);
        if ((this->m_isArrayType & 1U) == 0) {
          (**(code **)(_textureTarget + 0x1390))
                    (0x9100,this->m_numSamples,fboAttachment,0x100,0x100,0);
        }
        else {
          (**(code **)(_textureTarget + 0x13a8))
                    (0x9102,this->m_numSamples,fboAttachment,0x100,0x100,8,0);
        }
        dVar3 = (**(code **)(_textureTarget + 0x800))();
        glu::checkError(dVar3,"texstorage",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                        ,0x498);
        (**(code **)(_textureTarget + 0x6d0))(1,&this->m_fboID);
        (**(code **)(_textureTarget + 0x78))(0x8d40,this->m_fboID);
        if ((this->m_isArrayType & 1U) == 0) {
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_7d8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_7d8,(char (*) [37])"Attaching multisample texture to fbo");
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_7d8);
          (**(code **)(_textureTarget + 0x6a0))(0x8d40,local_24,uStack_20,this->m_textureID,0);
        }
        else {
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_650,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_650,(char (*) [43])"Attaching multisample texture array layer "
                             );
          local_654 = 3;
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_654);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [8])0x2c3c72e);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_650);
          (**(code **)(_textureTarget + 0x6b8))(0x8d40,local_24,this->m_textureID,0,3);
        }
        dVar3 = (**(code **)(_textureTarget + 0x800))();
        glu::checkError(dVar3,"gen fbo",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                        ,0x4a9);
        genDrawShader(this);
        genSamplerShader(this);
        return extraout_EAX;
      }
      local_312 = 1;
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&maxTextureLayers,"Larger GL_MAX_TEXTURE_SIZE is required",&local_311);
      tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)&maxTextureLayers);
      local_312 = 0;
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  local_115 = 1;
  pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_ec = 0x100;
  de::toString<int>(&local_e8,&local_ec);
  std::operator+(&local_c8,"render target size must be at least ",&local_e8);
  std::operator+(&local_a8,&local_c8,"x");
  maxSamples = 0x100;
  de::toString<int>(&local_110,&maxSamples);
  std::operator+(&local_88,&local_a8,&local_110);
  tcu::NotSupportedError::NotSupportedError(pNVar5,&local_88);
  local_115 = 0;
  __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void MultisampleTextureUsageCase::init (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const glw::GLenum		internalFormat	= (m_isColorFormat) ? (GL_R8) : (m_isSignedFormat) ? (GL_R8I) : (m_isUnsignedFormat) ? (GL_R8UI) : (m_isDepthFormat) ? (GL_DEPTH_COMPONENT32F) : (0);
	const glw::GLenum		textureTarget	= (m_isArrayType) ? (GL_TEXTURE_2D_MULTISAMPLE_ARRAY) : (GL_TEXTURE_2D_MULTISAMPLE);
	const glw::GLenum		fboAttachment	= (m_isDepthFormat) ? (GL_DEPTH_ATTACHMENT) : (GL_COLOR_ATTACHMENT0);
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	DE_ASSERT(internalFormat);

	// requirements

	if (m_isArrayType && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		throw tcu::NotSupportedError("Test requires OES_texture_storage_multisample_2d_array extension");
	if (m_context.getRenderTarget().getWidth() < s_textureSize || m_context.getRenderTarget().getHeight() < s_textureSize)
		throw tcu::NotSupportedError("render target size must be at least " + de::toString(static_cast<int>(s_textureSize)) + "x" + de::toString(static_cast<int>(s_textureSize)));

	{
		glw::GLint maxSamples = 0;
		gl.getInternalformativ(textureTarget, internalFormat, GL_SAMPLES, 1, &maxSamples);

		if (m_numSamples > maxSamples)
			throw tcu::NotSupportedError("Requested sample count is greater than supported");

		m_testCtx.getLog() << tcu::TestLog::Message << "Max sample count for " << glu::getTextureFormatStr(internalFormat) << ": " << maxSamples << tcu::TestLog::EndMessage;
	}

	{
		GLint maxTextureSize = 0;
		gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);

		if (s_textureSize > maxTextureSize)
			throw tcu::NotSupportedError("Larger GL_MAX_TEXTURE_SIZE is required");
	}

	if (m_isArrayType)
	{
		GLint maxTextureLayers = 0;
		gl.getIntegerv(GL_MAX_ARRAY_TEXTURE_LAYERS, &maxTextureLayers);

		if (s_textureArraySize > maxTextureLayers)
			throw tcu::NotSupportedError("Larger GL_MAX_ARRAY_TEXTURE_LAYERS is required");
	}

	// create texture

	m_testCtx.getLog() << tcu::TestLog::Message << "Creating multisample " << ((m_isDepthFormat) ? ("depth") : ("")) << " texture" << ((m_isArrayType) ? (" array") : ("")) << tcu::TestLog::EndMessage;

	gl.genTextures(1, &m_textureID);
	gl.bindTexture(textureTarget, m_textureID);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind texture");

	if (m_isArrayType)
		gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, m_numSamples, internalFormat, s_textureSize, s_textureSize, s_textureArraySize, GL_FALSE);
	else
		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, m_numSamples, internalFormat, s_textureSize, s_textureSize, GL_FALSE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texstorage");

	// create fbo for drawing

	gl.genFramebuffers(1, &m_fboID);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fboID);

	if (m_isArrayType)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Attaching multisample texture array layer " << static_cast<int>(s_textureLayer) << " to fbo" << tcu::TestLog::EndMessage;
		gl.framebufferTextureLayer(GL_FRAMEBUFFER, fboAttachment, m_textureID, 0, s_textureLayer);
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Attaching multisample texture to fbo" << tcu::TestLog::EndMessage;
		gl.framebufferTexture2D(GL_FRAMEBUFFER, fboAttachment, textureTarget, m_textureID, 0);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "gen fbo");

	// create shader for rendering to fbo
	genDrawShader();

	// create shader for sampling the texture rendered to
	genSamplerShader();
}